

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::FilterObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              JavascriptArray *newArr,RecyclableObject *newObj,unsigned_long newStart,
              RecyclableObject *callBackFn,Var thisArg,ScriptContext *scriptContext)

{
  BOOL BVar1;
  uint uVar2;
  ThreadContext *pTVar3;
  Var newValue;
  JavascriptMethod p_Var4;
  Var pvVar5;
  Var aItem;
  BigIndex idxDest;
  BigIndex index;
  CallInfo local_c0;
  CallInfo local_b8;
  undefined1 local_b0 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  unsigned_long uStack_98;
  BOOL hasItem;
  unsigned_long k;
  BigIndex i;
  Var selected;
  Var element;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  unsigned_long newStart_local;
  RecyclableObject *newObj_local;
  JavascriptArray *newArr_local;
  unsigned_long start_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  
  jsReentLock._24_8_ = newStart;
  pTVar3 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_60,pTVar3);
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,obj);
  i.bigIndex = 0;
  BigIndex::BigIndex((BigIndex *)&k,jsReentLock._24_8_);
  for (uStack_98 = start; uStack_98 < length; uStack_98 = uStack_98 + 1) {
    JsReentLock::unlock((JsReentLock *)local_60);
    autoReentrancyHandler._12_4_ = Js::JavascriptOperators::HasItem(obj,uStack_98);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    JsReentLock::relock((JsReentLock *)local_60);
    if (autoReentrancyHandler._12_4_ != 0) {
      JsReentLock::unlock((JsReentLock *)local_60);
      newValue = Js::JavascriptOperators::GetItem(obj,uStack_98,scriptContext);
      pTVar3 = ScriptContext::GetThreadContext(scriptContext);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_b0,pTVar3);
      pTVar3 = ScriptContext::GetThreadContext(scriptContext);
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar3);
      pTVar3 = ScriptContext::GetThreadContext(scriptContext);
      ThreadContext::AssertJsReentrancy(pTVar3);
      p_Var4 = RecyclableObject::GetEntryPoint(callBackFn);
      CallInfo::CallInfo(&local_b8,CallFlags_Value,4);
      CallInfo::CallInfo(&local_c0,CallFlags_Value,4);
      pvVar5 = JavascriptNumber::ToVar(uStack_98,scriptContext);
      aItem = (Var)0x0;
      i.bigIndex = (uint64)(*p_Var4)(callBackFn,(CallInfo)callBackFn,local_b8,0,0,0,0,local_c0,
                                     thisArg,newValue,pvVar5,obj);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_b0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
      BVar1 = JavascriptConversion::ToBoolean((Var)i.bigIndex,scriptContext);
      if (BVar1 != 0) {
        if (newArr == (JavascriptArray *)0x0) {
          JsReentLock::unlock((JsReentLock *)local_60);
          idxDest.bigIndex = (uint64)newValue;
          idxDest.index = i.index;
          idxDest._4_4_ = i._4_4_;
          uVar2 = SetArrayLikeObjects((JavascriptArray *)newObj,(RecyclableObject *)(k & 0xffffffff)
                                      ,idxDest,aItem);
          index.bigIndex = (uint64)aItem;
          index.index = i.index;
          index._4_4_ = i._4_4_;
          ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar2,(BOOL)scriptContext,
                              (ScriptContext *)(k & 0xffffffff),index);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          JsReentLock::relock((JsReentLock *)local_60);
        }
        else {
          GenericDirectSetItemAt(newArr,(BigIndex *)&k,newValue);
        }
        BigIndex::operator++((BigIndex *)&k);
      }
    }
  }
  if (newArr != (JavascriptArray *)0x0) {
    (*(newArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
      .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_60);
  return newObj;
}

Assistant:

Var JavascriptArray::FilterObjectHelper(RecyclableObject* obj, T length, T start, JavascriptArray* newArr, RecyclableObject* newObj, T newStart,
        RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var selected = nullptr;
        BigIndex i = BigIndex(newStart);

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        selected = CALL_ENTRYPOINT(scriptContext->GetThreadContext(),
                                callBackFn->GetEntryPoint(), callBackFn, CallInfo(CallFlags_Value, 4),
                                thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(selected, scriptContext))
                {
                    if (newArr)
                    {
                        newArr->GenericDirectSetItemAt(i, element);
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));
                    }

                    ++i;
                }
            }
        }

#ifdef VALIDATE_ARRAY
        if (newArr)
        {
            newArr->ValidateArray();
        }
#endif

        return newObj;
    }